

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall GraphPropagator::fullExpl(GraphPropagator *this,vec<Lit> *ps)

{
  BoolView *pBVar1;
  Lit LVar2;
  undefined8 in_RAX;
  int i;
  long lVar3;
  long lVar4;
  undefined8 local_38;
  
  lVar4 = 0;
  local_38 = in_RAX;
  for (lVar3 = 0; lVar3 < (int)(this->vs).sz; lVar3 = lVar3 + 1) {
    pBVar1 = (this->vs).data;
    if (sat.assigns.data[*(uint *)((long)&pBVar1->v + lVar4)] != '\0') {
      LVar2 = BoolView::getValLit((BoolView *)
                                  ((long)&(pBVar1->super_Var).super_Branching._vptr_Branching +
                                  lVar4));
      local_38 = CONCAT44(LVar2.x,local_38._0_4_);
      vec<Lit>::push(ps,(Lit *)((long)&local_38 + 4));
    }
    lVar4 = lVar4 + 0x10;
  }
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < (int)(this->es).sz; lVar3 = lVar3 + 1) {
    pBVar1 = (this->es).data;
    if (sat.assigns.data[*(uint *)((long)&pBVar1->v + lVar4)] != '\0') {
      LVar2 = BoolView::getValLit((BoolView *)
                                  ((long)&(pBVar1->super_Var).super_Branching._vptr_Branching +
                                  lVar4));
      local_38 = CONCAT44(local_38._4_4_,LVar2.x);
      vec<Lit>::push(ps,(Lit *)&local_38);
    }
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

void GraphPropagator::fullExpl(vec<Lit>& ps) {
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed()) {
			ps.push(getNodeVar(i).getValLit());
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed()) {
			ps.push(getEdgeVar(i).getValLit());
		}
	}
}